

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O1

int Assimp_CompareDump(char **params,uint num)

{
  char *pcVar1;
  int iVar2;
  FILE *__stream;
  FILE *__stream_00;
  ostream *poVar3;
  size_t sVar4;
  comparer_context comp;
  comparer_context local_f8;
  
  if ((num != 1) || (iVar2 = strcmp(*params,"-h"), iVar2 != 0)) {
    pcVar1 = *params;
    iVar2 = strcmp(pcVar1,"--help");
    if ((iVar2 != 0) && (iVar2 = strcmp(pcVar1,"-?"), iVar2 != 0)) {
      if (num < 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "assimp cmpdump: Invalid number of arguments. See \'assimp cmpdump --help\'\r\n",
                   0x4a);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
        return 1;
      }
      iVar2 = strcmp(pcVar1,params[1]);
      if (iVar2 != 0) {
        __stream = fopen(pcVar1,"rb");
        if (__stream == (FILE *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"assimp cmpdump: Failure reading ACTUAL data from ",0x31)
          ;
          pcVar1 = *params;
          if (pcVar1 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x905318);
          }
          else {
            sVar4 = strlen(pcVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar4);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
          std::ostream::put('\x18');
          iVar2 = -5;
          std::ostream::flush();
        }
        else {
          __stream_00 = fopen(params[1],"rb");
          if (__stream_00 == (FILE *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"assimp cmpdump: Failure reading EXPECT data from ",
                       0x31);
            pcVar1 = params[1];
            if (pcVar1 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x905318);
            }
            else {
              sVar4 = strlen(pcVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar4)
              ;
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
            std::ostream::put('\x18');
            iVar2 = -6;
            std::ostream::flush();
          }
          else {
            comparer_context::comparer_context(&local_f8,(FILE *)__stream,(FILE *)__stream_00);
            fseek((FILE *)local_f8.actual,0x200,1);
            fseek((FILE *)local_f8.expect,0x200,1);
            CompareOnTheFly(&local_f8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Success (totally ",0x11);
            *(uint *)(asctime + *(long *)(std::cout + -0x18)) =
                 *(uint *)(asctime + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," chunks)",8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            iVar2 = 0;
            std::ostream::flush();
            std::
            _Deque_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ::~_Deque_base((_Deque_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            *)&local_f8.lengths);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_f8.debug_trace);
            std::
            deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
            ::~deque(&local_f8.history);
          }
          if (__stream_00 != (FILE *)0x0) {
            fclose(__stream_00);
          }
        }
        if (__stream == (FILE *)0x0) {
          return iVar2;
        }
        fclose(__stream);
        return iVar2;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"assimp cmpdump: same file, same content.",0x28);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
      std::ostream::put('\x18');
      std::ostream::flush();
      return 0;
    }
  }
  printf("%s",AICMD_MSG_CMPDUMP_HELP);
  return 0;
}

Assistant:

int Assimp_CompareDump (const char* const* params, unsigned int num)
{
    // --help
    if ((num == 1 && !strcmp( params[0], "-h")) || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
        printf("%s",AICMD_MSG_CMPDUMP_HELP);
        return 0;
    }

    // assimp cmpdump actual expected
    if (num < 2) {
        std::cout << "assimp cmpdump: Invalid number of arguments. "
            "See \'assimp cmpdump --help\'\r\n" << std::endl;
        return 1;
    }

    if(!strcmp(params[0],params[1])) {
        std::cout << "assimp cmpdump: same file, same content." << std::endl;
        return 0;
    }

    class file_ptr
    {
    public:
        file_ptr(FILE *p)
            : m_file(p)
        {}
        ~file_ptr()
        {
            if (m_file)
            {
                fclose(m_file);
                m_file = NULL;
            }
        }

        operator FILE *() { return m_file; }

    private:
        FILE *m_file;
    };
    file_ptr actual(fopen(params[0],"rb"));
    if (!actual) {
        std::cout << "assimp cmpdump: Failure reading ACTUAL data from " <<
            params[0]  << std::endl;
        return -5;
    }
    file_ptr expected(fopen(params[1],"rb"));
    if (!expected) {
        std::cout << "assimp cmpdump: Failure reading EXPECT data from " <<
            params[1]  << std::endl;
        return -6;
    }

    comparer_context comp(actual,expected);
    try {
        CheckHeader(comp);
        CompareOnTheFly(comp);
    }
    catch(const compare_fails_exception& ex) {
        printf("%s",ex.what());
        return -1;
    }
    catch(...) {
        // we don't bother checking too rigourously here, so
        // we might end up here ...
        std::cout << "Unknown failure, are the input files well-defined?";
        return -3;
    }

    std::cout << "Success (totally " << std::dec << comp.get_num_chunks() <<
        " chunks)" << std::endl;

    return 0;
}